

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

uint64_t CombinedShannonEntropy_SSE2(uint32_t *X,uint32_t *Y)

{
  ushort uVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long in_RSI;
  long in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int x;
  uint32_t xy;
  int32_t j;
  int32_t my;
  int32_t mx;
  __m128i y4;
  __m128i x4;
  __m128i y3;
  __m128i x3;
  __m128i y2;
  __m128i x2;
  __m128i y1;
  __m128i x1;
  __m128i y0;
  __m128i x0;
  __m128i zero;
  uint32_t sumXY;
  uint32_t sumX;
  uint64_t retval;
  int i;
  uint32_t in_stack_fffffffffffffd94;
  undefined4 local_260;
  undefined8 local_198;
  undefined4 local_18c;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  local_198 = 0;
  for (local_18c = 0; local_18c < 0x100; local_18c = local_18c + 0x10) {
    auVar6 = packssdw(*(undefined1 (*) [16])(in_RDI + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RDI + 0x10 + (long)local_18c * 4));
    auVar5 = packssdw(*(undefined1 (*) [16])(in_RDI + 0x20 + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RDI + 0x30 + (long)local_18c * 4));
    auVar5 = packsswb(auVar6,auVar5);
    auVar7 = packssdw(*(undefined1 (*) [16])(in_RSI + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RSI + 0x10 + (long)local_18c * 4));
    auVar6 = packssdw(*(undefined1 (*) [16])(in_RSI + 0x20 + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RSI + 0x30 + (long)local_18c * 4));
    auVar7 = packsswb(auVar7,auVar6);
    local_18 = auVar5[0];
    uStack_17 = auVar5[1];
    uStack_16 = auVar5[2];
    uStack_15 = auVar5[3];
    uStack_14 = auVar5[4];
    uStack_13 = auVar5[5];
    uStack_12 = auVar5[6];
    uStack_11 = auVar5[7];
    uStack_10 = auVar5[8];
    uStack_f = auVar5[9];
    uStack_e = auVar5[10];
    uStack_d = auVar5[0xb];
    uStack_c = auVar5[0xc];
    uStack_b = auVar5[0xd];
    uStack_a = auVar5[0xe];
    uStack_9 = auVar5[0xf];
    auVar6[1] = -('\0' < uStack_17);
    auVar6[0] = -('\0' < local_18);
    auVar6[2] = -('\0' < uStack_16);
    auVar6[3] = -('\0' < uStack_15);
    auVar6[4] = -('\0' < uStack_14);
    auVar6[5] = -('\0' < uStack_13);
    auVar6[6] = -('\0' < uStack_12);
    auVar6[7] = -('\0' < uStack_11);
    auVar6[8] = -('\0' < uStack_10);
    auVar6[9] = -('\0' < uStack_f);
    auVar6[10] = -('\0' < uStack_e);
    auVar6[0xb] = -('\0' < uStack_d);
    auVar6[0xc] = -('\0' < uStack_c);
    auVar6[0xd] = -('\0' < uStack_b);
    auVar6[0xe] = -('\0' < uStack_a);
    auVar6[0xf] = -('\0' < uStack_9);
    uVar1 = (ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
            (ushort)((byte)-('\0' < uStack_9) >> 7) << 0xf;
    local_38 = auVar7[0];
    uStack_37 = auVar7[1];
    uStack_36 = auVar7[2];
    uStack_35 = auVar7[3];
    uStack_34 = auVar7[4];
    uStack_33 = auVar7[5];
    uStack_32 = auVar7[6];
    uStack_31 = auVar7[7];
    uStack_30 = auVar7[8];
    uStack_2f = auVar7[9];
    uStack_2e = auVar7[10];
    uStack_2d = auVar7[0xb];
    uStack_2c = auVar7[0xc];
    uStack_2b = auVar7[0xd];
    uStack_2a = auVar7[0xe];
    uStack_29 = auVar7[0xf];
    auVar5[1] = -('\0' < uStack_37);
    auVar5[0] = -('\0' < local_38);
    auVar5[2] = -('\0' < uStack_36);
    auVar5[3] = -('\0' < uStack_35);
    auVar5[4] = -('\0' < uStack_34);
    auVar5[5] = -('\0' < uStack_33);
    auVar5[6] = -('\0' < uStack_32);
    auVar5[7] = -('\0' < uStack_31);
    auVar5[8] = -('\0' < uStack_30);
    auVar5[9] = -('\0' < uStack_2f);
    auVar5[10] = -('\0' < uStack_2e);
    auVar5[0xb] = -('\0' < uStack_2d);
    auVar5[0xc] = -('\0' < uStack_2c);
    auVar5[0xd] = -('\0' < uStack_2b);
    auVar5[0xe] = -('\0' < uStack_2a);
    auVar5[0xf] = -('\0' < uStack_29);
    for (local_260 = (uint)(ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                                    (ushort)((byte)-('\0' < uStack_29) >> 7) << 0xf | uVar1);
        local_260 != 0; local_260 = local_260 - 1 & local_260) {
      iVar2 = BitsCtz(local_260);
      if (((int)(uint)uVar1 >> ((byte)iVar2 & 0x1f) & 1U) != 0) {
        in_stack_fffffffffffffd94 = *(uint32_t *)(in_RDI + (long)(local_18c + iVar2) * 4);
        uVar3 = VP8LFastSLog2(in_stack_fffffffffffffd94);
        local_198 = uVar3 + local_198;
      }
      uVar3 = VP8LFastSLog2(in_stack_fffffffffffffd94);
      local_198 = uVar3 + local_198;
    }
  }
  uVar3 = VP8LFastSLog2(in_stack_fffffffffffffd94);
  uVar4 = VP8LFastSLog2(in_stack_fffffffffffffd94);
  return (uVar3 + uVar4) - local_198;
}

Assistant:

static uint64_t CombinedShannonEntropy_SSE2(const uint32_t X[256],
                                            const uint32_t Y[256]) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0, sumXY = 0;
  const __m128i zero = _mm_setzero_si128();

  for (i = 0; i < 256; i += 16) {
    const __m128i x0 = _mm_loadu_si128((const __m128i*)(X + i +  0));
    const __m128i y0 = _mm_loadu_si128((const __m128i*)(Y + i +  0));
    const __m128i x1 = _mm_loadu_si128((const __m128i*)(X + i +  4));
    const __m128i y1 = _mm_loadu_si128((const __m128i*)(Y + i +  4));
    const __m128i x2 = _mm_loadu_si128((const __m128i*)(X + i +  8));
    const __m128i y2 = _mm_loadu_si128((const __m128i*)(Y + i +  8));
    const __m128i x3 = _mm_loadu_si128((const __m128i*)(X + i + 12));
    const __m128i y3 = _mm_loadu_si128((const __m128i*)(Y + i + 12));
    const __m128i x4 = _mm_packs_epi16(_mm_packs_epi32(x0, x1),
                                       _mm_packs_epi32(x2, x3));
    const __m128i y4 = _mm_packs_epi16(_mm_packs_epi32(y0, y1),
                                       _mm_packs_epi32(y2, y3));
    const int32_t mx = _mm_movemask_epi8(_mm_cmpgt_epi8(x4, zero));
    int32_t my = _mm_movemask_epi8(_mm_cmpgt_epi8(y4, zero)) | mx;
    while (my) {
      const int32_t j = BitsCtz(my);
      uint32_t xy;
      if ((mx >> j) & 1) {
        const int x = X[i + j];
        sumXY += x;
        retval += VP8LFastSLog2(x);
      }
      xy = X[i + j] + Y[i + j];
      sumX += xy;
      retval += VP8LFastSLog2(xy);
      my &= my - 1;
    }
  }
  retval = VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY) - retval;
  return retval;
}